

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* get_header_values(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *__return_storage_ptr__,
                   span<cinatra::http_header,_18446744073709551615UL> *resp_headers,string_view key)

{
  pointer *ppbVar1;
  size_t sVar2;
  pointer phVar3;
  iterator __position;
  char *pcVar4;
  int iVar5;
  pointer phVar6;
  size_t __n;
  basic_string_view<char,_std::char_traits<char>_> *__args;
  
  __n = key._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (resp_headers->_M_extent)._M_extent_value;
  if (sVar2 != 0) {
    phVar3 = resp_headers->_M_ptr;
    __args = &phVar3->value;
    do {
      if (__args[-1]._M_len == __n) {
        if (__n != 0) {
          iVar5 = bcmp(__args[-1]._M_str,key._M_str,__n);
          if (iVar5 != 0) goto LAB_00240304;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)__return_storage_ptr__,__position,__args);
        }
        else {
          pcVar4 = __args->_M_str;
          (__position._M_current)->_M_len = __args->_M_len;
          (__position._M_current)->_M_str = pcVar4;
          ppbVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
      }
LAB_00240304:
      phVar6 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (phVar6 != phVar3 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string_view> get_header_values(
    std::span<http_header> &resp_headers, std::string_view key) {
  std::vector<std::string_view> values{};
  for (const auto &p : resp_headers) {
    if (p.name == key)
      values.push_back(p.value);
  }
  return values;
}